

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_manual_::run(Test_intlog_log2floor_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_460;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string_view local_398;
  undefined4 local_388;
  uint local_384;
  Cmp cmp__3;
  uint *tr__3;
  uint *local_370;
  uint *tl__3;
  char *pcStack_360;
  undefined8 local_358;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_348;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string_view local_280;
  undefined4 local_270;
  uint local_26c;
  Cmp cmp__2;
  uint *tr__2;
  uint *local_258;
  uint *tl__2;
  char *pcStack_248;
  undefined8 local_240;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_230;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string_view local_168;
  undefined4 local_158;
  uint local_154;
  Cmp cmp__1;
  uint *tr__1;
  uint *local_140;
  uint32_t *tl__1;
  char *pcStack_130;
  undefined8 local_128;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_118;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_e1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  undefined4 local_30;
  uint local_2c;
  Cmp cmp_;
  uint *tr_;
  uint *local_18;
  uint *tl_;
  Test_intlog_log2floor_manual_ *this_local;
  
  tl_ = (uint *)this;
  tr_._4_4_ = log2floor<unsigned_int,_0>(0);
  local_18 = (uint *)((long)&tr_ + 4);
  local_2c = 0;
  _cmp_ = &local_2c;
  local_30 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_18,_cmp_);
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_e0,local_18);
    local_e1 = 1;
    std::operator+(&local_c0,"Comparison failed: log2floor(0u) == 0u (with \"log2floor(0u)\"=",
                   &local_e0);
    local_f5 = 1;
    std::operator+(&local_a0,&local_c0,", \"0u\"=");
    local_f6 = 1;
    stringify<unsigned_int>(&local_118,_cmp_);
    local_119 = 1;
    std::operator+(&local_80,&local_a0,&local_118);
    local_11a = 1;
    std::operator+(&local_60,&local_80,")");
    local_11b = 1;
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    tl__1 = (uint32_t *)anon_var_dwarf_4200b;
    pcStack_130 = "run";
    local_128 = 0x5c;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc.line = 0x5c;
    assertFail(local_40,loc);
  }
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  tr__1._4_4_ = log2floor_debruijn(0);
  local_140 = (uint *)((long)&tr__1 + 4);
  local_154 = 0;
  _cmp__1 = &local_154;
  local_158 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_140,_cmp__1);
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_208,local_140);
    local_209 = 1;
    std::operator+(&local_1e8,
                   "Comparison failed: log2floor_debruijn(0u) == 0u (with \"log2floor_debruijn(0u)\"="
                   ,&local_208);
    local_20a = 1;
    std::operator+(&local_1c8,&local_1e8,", \"0u\"=");
    local_20b = 1;
    stringify<unsigned_int>(&local_230,_cmp__1);
    local_231 = 1;
    std::operator+(&local_1a8,&local_1c8,&local_230);
    local_232 = 1;
    std::operator+(&local_188,&local_1a8,")");
    local_233 = 1;
    local_168 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
    tl__2 = (uint *)anon_var_dwarf_4200b;
    pcStack_248 = "run";
    local_240 = 0x5d;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_00.line = 0x5d;
    assertFail(local_168,loc_00);
  }
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  tr__2._4_4_ = log2floor_fast<unsigned_int>(0);
  local_258 = (uint *)((long)&tr__2 + 4);
  local_26c = 0;
  _cmp__2 = &local_26c;
  local_270 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_258,_cmp__2);
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_320,local_258);
    local_321 = 1;
    std::operator+(&local_300,
                   "Comparison failed: log2floor_fast(0u) == 0u (with \"log2floor_fast(0u)\"=",
                   &local_320);
    local_322 = 1;
    std::operator+(&local_2e0,&local_300,", \"0u\"=");
    local_323 = 1;
    stringify<unsigned_int>(&local_348,_cmp__2);
    local_349 = 1;
    std::operator+(&local_2c0,&local_2e0,&local_348);
    local_34a = 1;
    std::operator+(&local_2a0,&local_2c0,")");
    local_34b = 1;
    local_280 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a0);
    tl__3 = (uint *)anon_var_dwarf_4200b;
    pcStack_360 = "run";
    local_358 = 0x5e;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_01.line = 0x5e;
    assertFail(local_280,loc_01);
  }
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  tr__3._4_4_ = log2floor_naive<unsigned_int>(0);
  local_370 = (uint *)((long)&tr__3 + 4);
  local_384 = 0;
  _cmp__3 = &local_384;
  local_388 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int>(local_370,_cmp__3);
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  if (!bVar1) {
    stringify<unsigned_int>(&local_438,local_370);
    local_439 = 1;
    std::operator+(&local_418,
                   "Comparison failed: log2floor_naive(0u) == 0u (with \"log2floor_naive(0u)\"=",
                   &local_438);
    local_43a = 1;
    std::operator+(&local_3f8,&local_418,", \"0u\"=");
    local_43b = 1;
    stringify<unsigned_int>(&local_460,_cmp__3);
    std::operator+(&local_3d8,&local_3f8,&local_460);
    std::operator+(&local_3b8,&local_3d8,")");
    local_398 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b8);
    loc_02.function = "run";
    loc_02.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_02.line = 0x5f;
    assertFail(local_398,loc_02);
  }
  return;
}

Assistant:

BITMANIP_TEST(intlog, log2floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log2floor(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_debruijn(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_fast(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_naive(0u), 0u);
}